

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::detail::adjust_precision(int *precision,int exp10)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  int *in_RDI;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (0 < in_ESI) {
    iVar3 = *in_RDI;
    iVar1 = max_value<int>();
    if (iVar1 - in_ESI < iVar3) {
      pcVar2 = (char *)__cxa_allocate_exception(0x10);
      format_error::runtime_error((format_error *)CONCAT44(in_stack_ffffffffffffffe4,iVar3),pcVar2);
      __cxa_throw(pcVar2,&format_error::typeinfo,format_error::~format_error);
    }
  }
  *in_RDI = in_ESI + *in_RDI;
  return;
}

Assistant:

inline FMT_CONSTEXPR20 void adjust_precision(int& precision, int exp10) {
  // Adjust fixed precision by exponent because it is relative to decimal
  // point.
  if (exp10 > 0 && precision > max_value<int>() - exp10)
    FMT_THROW(format_error("number is too big"));
  precision += exp10;
}